

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_frsqrt_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  fpr_t *pfVar2;
  float_status *pfVar3;
  byte bVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  float32 fVar9;
  float32 fVar10;
  float64 fVar11;
  float64 fVar12;
  uint uVar13;
  float64 *pfVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float_status *status_1;
  bool bVar20;
  uint32_t unaff_retaddr;
  float_status *status;
  wr_t wx;
  float64 local_48;
  float64 fStack_40;
  float64 *local_38;
  
  lVar5 = (ulong)ws * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar3 = &(env->active_tc).msa_fp_status;
    lVar16 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = float32_sqrt_mips(*(float32 *)
                                 ((long)(env->active_fpu).fpr + lVar16 * 4 + lVar5 + -0x228),pfVar3)
      ;
      fVar9 = float32_div_mips(0x3f800000,fVar9,pfVar3);
      *(float32 *)((long)&local_48 + lVar16 * 4) = fVar9;
      fVar10 = float32_sqrt_mips(*(float32 *)
                                  ((long)(env->active_fpu).fpr + lVar16 * 4 + lVar5 + -0x228),pfVar3
                                );
      bVar20 = true;
      if ((fVar10 & 0x7fffffff) != 0x7f800000) {
        iVar7 = float32_is_quiet_nan_mips(fVar9,pfVar3);
        bVar20 = iVar7 != 0;
      }
      if ((fVar9 & 0x7fffffff) == 0) {
        uVar19 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar19 = (uint)bVar4;
        if ((fVar9 & 0x7f800000) == 0) {
          uVar19 = bVar4 | 0x10;
        }
      }
      uVar8 = ieee_ex_to_mips_mips(uVar19);
      uVar13 = (env->active_tc).msacsr;
      uVar18 = (uVar13 & 0x1000000) >> 0x18 & uVar19 >> 6;
      uVar15 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar15 = uVar18;
      }
      if (uVar19 < 0x80) {
        uVar15 = uVar18;
      }
      uVar15 = uVar15 | uVar8;
      uVar18 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar17 = uVar18 | uVar15;
      uVar19 = uVar8 & 0xfffffffc;
      if ((uVar18 != 0 || (uVar15 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar19 = uVar17;
      }
      if ((uVar15 & 2) == 0) {
        uVar19 = uVar17;
      }
      uVar15 = 1;
      if ((uVar19 & 0x18) != 0) {
        uVar15 = uVar19;
      }
      if (bVar20) {
        uVar15 = uVar19;
      }
      if ((uVar15 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar19 = uVar15 << 0xc;
LAB_00772c4d:
        (env->active_tc).msacsr = uVar19 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar15) != 0) goto LAB_00772c69;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar19 = uVar15 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_00772c4d;
        }
LAB_00772c69:
        fVar9 = float32_default_nan_mips(pfVar3);
        *(float32 *)((long)&local_48 + lVar16 * 4) = fVar9 & 0xffffffc0 ^ 0x400000 | uVar15;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1b89,
                    "void helper_msa_frsqrt_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    pfVar3 = &(env->active_tc).msa_fp_status;
    pfVar14 = &local_48;
    lVar16 = 0;
    bVar20 = true;
    do {
      bVar6 = bVar20;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar11 = float64_sqrt_mips(*(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar16 * 8 + lVar5 + -0x228),pfVar3
                                );
      fVar11 = float64_div_mips(0x3ff0000000000000,fVar11,pfVar3);
      *pfVar14 = fVar11;
      local_38 = pfVar14;
      fVar12 = float64_sqrt_mips(*(float64 *)
                                  ((long)(env->active_fpu).fpr + lVar16 * 8 + lVar5 + -0x228),pfVar3
                                );
      bVar20 = true;
      if ((fVar12 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
        iVar7 = float64_is_quiet_nan_mips(fVar11,pfVar3);
        bVar20 = iVar7 != 0;
      }
      if ((fVar11 & 0x7fffffffffffffff) == 0) {
        uVar19 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar19 = (uint)bVar4;
        if ((fVar11 & 0x7ff0000000000000) == 0) {
          uVar19 = bVar4 | 0x10;
        }
      }
      uVar8 = ieee_ex_to_mips_mips(uVar19);
      uVar13 = (env->active_tc).msacsr;
      uVar18 = (uVar13 & 0x1000000) >> 0x18 & uVar19 >> 6;
      uVar15 = 3;
      if ((uVar13 & 0x1000000) == 0) {
        uVar15 = uVar18;
      }
      if (uVar19 < 0x80) {
        uVar15 = uVar18;
      }
      uVar15 = uVar15 | uVar8;
      uVar17 = (uint)((uVar13 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar18 = uVar17 | uVar15;
      uVar19 = uVar8 & 0xfffffffc;
      if ((uVar17 != 0 || (uVar15 & 1) != 0) || (uVar13 & 0x100) != 0) {
        uVar19 = uVar18;
      }
      if ((uVar15 & 2) == 0) {
        uVar19 = uVar18;
      }
      uVar15 = 1;
      if ((uVar19 & 0x18) != 0) {
        uVar15 = uVar19;
      }
      if (bVar20) {
        uVar15 = uVar19;
      }
      if ((uVar15 & (uVar13 >> 7 & 0x1f | 0x20)) == 0) {
        uVar19 = uVar15 << 0xc;
LAB_00772a9f:
        (env->active_tc).msacsr = uVar19 & 0x3f000 | uVar13;
        if (((uVar13 >> 7 & 0x1f | 0x20) & uVar15) != 0) goto LAB_00772abf;
      }
      else {
        if ((uVar13 >> 0x12 & 1) == 0) {
          uVar19 = uVar15 << 0xc | uVar13;
          uVar13 = uVar13 & 0xfff80fff;
          goto LAB_00772a9f;
        }
LAB_00772abf:
        fVar11 = float64_default_nan_mips(pfVar3);
        *local_38 = (long)(int)uVar15 | fVar11 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar16 = 1;
      pfVar14 = &fStack_40;
      bVar20 = false;
    } while (bVar6);
  }
  uVar19 = (env->active_tc).msacsr;
  uVar13 = uVar19 >> 7 & 0x1f | 0x20;
  if ((uVar13 & uVar19 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar13);
  }
  (env->active_tc).msacsr = (uVar19 >> 0xc & 0x1f) << 2 | uVar19;
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fd = local_48;
  (&pfVar2->fd)[1] = fStack_40;
  return;
}

Assistant:

void helper_msa_frsqrt_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                          uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->w[i], float32_sqrt(pws->w[i],
                    &env->active_tc.msa_fp_status), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_RECIPROCAL(pwx->d[i], float64_sqrt(pws->d[i],
                    &env->active_tc.msa_fp_status), 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}